

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields_test.cc
# Opt level: O3

void __thiscall
RequiredFieldsTest_TestRequired_Test<Edition2023Type>::TestBody
          (RequiredFieldsTest_TestRequired_Test<Edition2023Type> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view json;
  string_view json_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view json_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view json_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  string_view json_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  string_view json_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  string_view json_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  string_view json_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  string_view json_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  string_view json_08;
  allocator_type local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"required_message","");
  __l._M_len = 1;
  __l._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l,&local_a1);
  json._M_str = "{}";
  json._M_len = 2;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  json_00._M_str = "{\"required_message\": {}}";
  json_00._M_len = 0x18;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"required_message","");
  plVar3 = local_58;
  local_68[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"optional_message.required_message","");
  __l_00._M_len = 2;
  __l_00._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_00,&local_a1);
  json_01._M_str = "\n      {\n        \"optional_message\": {}\n      }\n      ";
  json_01._M_len = 0x36;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_01,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  lVar2 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"required_message","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"optional_message.required_message","");
  plVar3 = local_38;
  local_48[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"optional_message.repeated_message[1].required_int32","");
  __l_01._M_len = 3;
  __l_01._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_01,&local_a1);
  json_02._M_str =
       "\n      {\n        \"optional_message\": {\n          \"repeated_message\": [\n            {\"required_int32\": 1},\n            {},\n            {\"required_int32\": 2}\n          ]\n        }\n      }\n      "
  ;
  json_02._M_len = 0xc0;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_02,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  lVar2 = -0x60;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"map_int32_message[5].required_int32","");
  __l_02._M_len = 1;
  __l_02._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_02,&local_a1);
  json_03._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_int32_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_03._M_len = 0xbe;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_03,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"map_int64_message[5].required_int32","");
  __l_03._M_len = 1;
  __l_03._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_03,&local_a1);
  json_04._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_int64_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_04._M_len = 0xbe;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_04,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"map_uint32_message[5].required_int32","");
  __l_04._M_len = 1;
  __l_04._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_04,&local_a1);
  json_05._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_uint32_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_05._M_len = 0xbf;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_05,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"map_uint64_message[5].required_int32","");
  __l_05._M_len = 1;
  __l_05._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_05,&local_a1);
  json_06._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_uint64_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_06._M_len = 0xbf;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_06,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"map_bool_message[true].required_int32","");
  __l_06._M_len = 1;
  __l_06._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_06,&local_a1);
  json_07._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_bool_message\": {\n          \"false\": {\"required_int32\": 1},\n          \"true\": {}\n        }\n      }\n      "
  ;
  json_07._M_len = 0x9e;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_07,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"map_string_message[\"d\\\"ef\"].required_int32","");
  __l_07._M_len = 1;
  __l_07._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__l_07,&local_a1);
  json_08._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_string_message\": {\n          \"abc\": {\"required_int32\": 1},\n          \"d\\\"ef\": {}\n        }\n      }\n      "
  ;
  json_08._M_len = 0x9f;
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,json_08,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(RequiredFieldsTest, TestRequired) {
  TestFixture::CheckRequired(R"json({})json", {"required_message"});
  TestFixture::CheckRequired(R"json({"required_message": {}})json", {});
  TestFixture::CheckRequired(
      R"json(
      {
        "optional_message": {}
      }
      )json",
      {"required_message", "optional_message.required_message"});

  // Repeated field.
  TestFixture::CheckRequired(
      R"json(
      {
        "optional_message": {
          "repeated_message": [
            {"required_int32": 1},
            {},
            {"required_int32": 2}
          ]
        }
      }
      )json",
      {"required_message", "optional_message.required_message",
       "optional_message.repeated_message[1].required_int32"});

  // Int32 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_int32_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_int32_message[5].required_int32"});

  // Int64 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_int64_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_int64_message[5].required_int32"});

  // Uint32 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_uint32_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_uint32_message[5].required_int32"});

  // Uint64 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_uint64_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_uint64_message[5].required_int32"});

  // Bool map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_bool_message": {
          "false": {"required_int32": 1},
          "true": {}
        }
      }
      )json",
      {"map_bool_message[true].required_int32"});

  // String map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_string_message": {
          "abc": {"required_int32": 1},
          "d\"ef": {}
        }
      }
      )json",
      {R"(map_string_message["d\"ef"].required_int32)"});
}